

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_routines_logist.c
# Opt level: O2

int WebRtcIsac_EncLogisticMulti2
              (Bitstr *streamdata,int16_t *dataQ7,uint16_t *envQ8,int N,int16_t isSWB12kHz)

{
  uint32_t *puVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint uVar11;
  short sVar12;
  uint uVar13;
  ushort *local_60;
  short *local_58;
  
  uVar7 = streamdata->W_upper;
  uVar9 = (ulong)streamdata->stream_index;
  uVar11 = 0;
  local_60 = envQ8;
  local_58 = dataQ7;
  if (N < 1) {
    N = uVar11;
  }
  do {
    if (uVar11 == N) {
      streamdata->stream_index = (uint32_t)uVar9;
      streamdata->W_upper = uVar7;
      return 0;
    }
    uVar13 = (uint)*local_58;
    uVar3 = *local_60;
    uVar4 = piecewise((uVar13 - 0x40) * (uint)uVar3);
    uVar5 = piecewise((uVar13 + 0x40) * (uint)uVar3);
    while (uVar8 = uVar4, uVar5 <= uVar8 + 1) {
      sVar12 = (short)uVar13;
      if (sVar12 < 1) {
        uVar13 = uVar13 + 0x80;
        *local_58 = (short)uVar13;
        uVar6 = piecewise((uint)*local_60 * (sVar12 + 0xc0));
        uVar4 = uVar5;
        uVar5 = uVar6;
      }
      else {
        *local_58 = (short)(uVar13 - 0x80);
        uVar4 = piecewise((uint)*local_60 * ((uVar13 & 0xffff) - 0xc0));
        uVar13 = uVar13 - 0x80;
        uVar5 = uVar8;
      }
    }
    uVar8 = uVar8 * (uVar7 >> 0x10) + (uVar8 * (uVar7 & 0xffff) >> 0x10) + 1;
    puVar1 = &streamdata->streamval;
    uVar13 = *puVar1;
    *puVar1 = *puVar1 + uVar8;
    if (CARRY4(uVar13,uVar8)) {
      puVar10 = streamdata->stream + (uVar9 - 1);
      do {
        *puVar10 = *puVar10 + '\x01';
        uVar2 = *puVar10;
        puVar10 = puVar10 + -1;
      } while (uVar2 == '\0');
    }
    local_58 = local_58 + 1;
    local_60 = local_60 + ((-(uint)(isSWB12kHz != 0) | uVar11 >> 1) & uVar11 & 1);
    for (uVar7 = (((uVar7 & 0xffff) * uVar5 >> 0x10) + (uVar7 >> 0x10) * uVar5) - uVar8;
        uVar7 < 0x1000000; uVar7 = uVar7 << 8) {
      streamdata->stream[uVar9] = *(uint8_t *)((long)&streamdata->streamval + 3);
      if (0x18e < (long)uVar9) {
        return -0x1928;
      }
      uVar9 = uVar9 + 1;
      streamdata->streamval = streamdata->streamval << 8;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int WebRtcIsac_EncLogisticMulti2(
    Bitstr *streamdata,      /* in-/output struct containing bitstream */
    int16_t *dataQ7,    /* input: data vector */
    const uint16_t *envQ8, /* input: side info vector defining the width of the pdf */
    const int N,       /* input: data vector length / 2 */
    const int16_t isSWB12kHz)
{
  uint32_t W_lower, W_upper;
  uint32_t W_upper_LSB, W_upper_MSB;
  uint8_t *stream_ptr;
  uint8_t *maxStreamPtr;
  uint8_t *stream_ptr_carry;
  uint32_t cdf_lo, cdf_hi;
  int k;

  /* point to beginning of stream buffer */
  stream_ptr = streamdata->stream + streamdata->stream_index;
  W_upper = streamdata->W_upper;

  maxStreamPtr = streamdata->stream + STREAM_SIZE_MAX_60 - 1;
  for (k = 0; k < N; k++)
  {
    /* compute cdf_lower and cdf_upper by evaluating the piecewise linear cdf */
    cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
    cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);

    /* test and clip if probability gets too small */
    while (cdf_lo+1 >= cdf_hi) {
      /* clip */
      if (*dataQ7 > 0) {
        *dataQ7 -= 128;
        cdf_hi = cdf_lo;
        cdf_lo = piecewise((*dataQ7 - 64) * *envQ8);
      } else {
        *dataQ7 += 128;
        cdf_lo = cdf_hi;
        cdf_hi = piecewise((*dataQ7 + 64) * *envQ8);
      }
    }

    dataQ7++;
    // increment only once per 4 iterations for SWB-16kHz or WB
    // increment only once per 2 iterations for SWB-12kHz
    envQ8 += (isSWB12kHz)? (k & 1):((k & 1) & (k >> 1));


    /* update interval */
    W_upper_LSB = W_upper & 0x0000FFFF;
    W_upper_MSB = W_upper >> 16;
    W_lower = W_upper_MSB * cdf_lo;
    W_lower += (W_upper_LSB * cdf_lo) >> 16;
    W_upper = W_upper_MSB * cdf_hi;
    W_upper += (W_upper_LSB * cdf_hi) >> 16;

    /* shift interval such that it begins at zero */
    W_upper -= ++W_lower;

    /* add integer to bitstream */
    streamdata->streamval += W_lower;

    /* handle carry */
    if (streamdata->streamval < W_lower)
    {
      /* propagate carry */
      stream_ptr_carry = stream_ptr;
      while (!(++(*--stream_ptr_carry)));
    }

    /* renormalize interval, store most significant byte of streamval and update streamval */
    while ( !(W_upper & 0xFF000000) )      /* W_upper < 2^24 */
    {
      W_upper <<= 8;
      *stream_ptr++ = (uint8_t) (streamdata->streamval >> 24);

      if(stream_ptr > maxStreamPtr)
      {
        return -ISAC_DISALLOWED_BITSTREAM_LENGTH;
      }
      streamdata->streamval <<= 8;
    }
  }

  /* calculate new stream_index */
  streamdata->stream_index = (int)(stream_ptr - streamdata->stream);
  streamdata->W_upper = W_upper;

  return 0;
}